

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::rot(Forth *this)

{
  uint Value;
  uint x;
  int n;
  Forth *this_local;
  
  requireDStackDepth(this,3,"ROT");
  Value = ForthStack<unsigned_int>::getTop(&this->dStack,2);
  ForthStack<unsigned_int>::moveStack(&this->dStack,2,1,2);
  ForthStack<unsigned_int>::setTop(&this->dStack,Value);
  return;
}

Assistant:

void rot() {
			REQUIRE_DSTACK_DEPTH(3, "ROT");
			auto n = 2;
			if (n > 0) {
				auto x = dStack.getTop(n);
				dStack.moveStack(n, n - 1, n);
				dStack.setTop(x);
			}
		}